

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<Fad<float>_>::~TPZVec(TPZVec<Fad<float>_> *this)

{
  Fad<float> *pFVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_018465f0;
  pFVar1 = this->fStore;
  if (pFVar1 != (Fad<float> *)0x0) {
    lVar2 = *(long *)&pFVar1[-1].defaultVal;
    if (lVar2 != 0) {
      lVar4 = lVar2 << 5;
      do {
        pvVar3 = *(void **)((long)pFVar1 + lVar4 + -0x10);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        *(undefined4 *)((long)pFVar1 + lVar4 + -0x18) = 0;
        *(undefined8 *)((long)pFVar1 + lVar4 + -0x10) = 0;
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
    }
    operator_delete__(&pFVar1[-1].defaultVal,lVar2 << 5 | 8);
  }
  operator_delete(this,0x20);
  return;
}

Assistant:

inline TPZVec<T>::~TPZVec() {
	if( fStore )
	{
		delete [] fStore;
	}
}